

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *tokenStart)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  bool local_272;
  bool local_222;
  allocator local_201;
  string local_200;
  bool local_1da;
  allocator local_1d9;
  undefined1 local_1d8 [6];
  bool finalizeTokenOk;
  undefined1 local_1b8 [8];
  Token comma;
  Value *pVStack_198;
  bool ok;
  Value *local_190;
  Value *value;
  undefined1 local_168 [8];
  string msg;
  string local_140;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  Token colon;
  undefined1 local_c0 [8];
  Value numberName;
  bool local_8d;
  bool initialTokenOk;
  undefined1 local_80 [8];
  Value init;
  string name;
  Token tokenName;
  Token *tokenStart_local;
  OurReader *this_local;
  
  std::__cxx11::string::string((string *)&init.limit_);
  Value::Value((Value *)local_80,objectValue);
  pVVar2 = currentValue(this);
  Value::swapPayload(pVVar2,(Value *)local_80);
  pVVar2 = currentValue(this);
  Value::setOffsetStart(pVVar2,(long)tokenStart->start_ - (long)this->begin_);
  do {
    bVar1 = readToken(this,(Token *)((long)&name.field_2 + 8));
    if (!bVar1) {
LAB_0013f6b7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_200,"Missing \'}\' or object member name",&local_201);
      this_local._7_1_ =
           addErrorAndRecover(this,&local_200,(Token *)((long)&name.field_2 + 8),tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      numberName.limit_._4_4_ = 1;
      goto LAB_0013f773;
    }
    local_8d = true;
    while( true ) {
      local_222 = false;
      if (name.field_2._8_4_ == 0xf) {
        local_222 = local_8d;
      }
      if (local_222 == false) break;
      local_8d = readToken(this,(Token *)((long)&name.field_2 + 8));
    }
    if (local_8d == false) goto LAB_0013f6b7;
    if ((name.field_2._8_4_ == 2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      this_local._7_1_ = 1;
      numberName.limit_._4_4_ = 1;
      goto LAB_0013f773;
    }
    std::__cxx11::string::clear();
    if (name.field_2._8_4_ == 5) {
      bVar1 = decodeString(this,(Token *)((long)&name.field_2 + 8),(string *)&init.limit_);
      if (!bVar1) {
        this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
        numberName.limit_._4_4_ = 1;
        goto LAB_0013f773;
      }
    }
    else {
      if ((name.field_2._8_4_ != 6) || (((this->features_).allowNumericKeys_ & 1U) == 0))
      goto LAB_0013f6b7;
      Value::Value((Value *)local_c0,nullValue);
      bVar1 = decodeNumber(this,(Token *)((long)&name.field_2 + 8),(Value *)local_c0);
      if (bVar1) {
        Value::asString_abi_cxx11_((string *)&colon.end_,(Value *)local_c0);
        std::__cxx11::string::operator=((string *)&init.limit_,(string *)&colon.end_);
        std::__cxx11::string::~string((string *)&colon.end_);
      }
      else {
        this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      }
      numberName.limit_._5_3_ = 0;
      numberName.limit_._4_1_ = !bVar1;
      Value::~Value((Value *)local_c0);
      if (numberName.limit_._4_4_ != 0) goto LAB_0013f773;
    }
    bVar1 = readToken(this,(Token *)local_f8);
    if ((!bVar1) || (local_f8._0_4_ != tokenMemberSeparator)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"Missing \':\' after object member name",&local_119);
      this_local._7_1_ = addErrorAndRecover(this,&local_118,(Token *)local_f8,tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      numberName.limit_._4_4_ = 1;
      goto LAB_0013f773;
    }
    uVar3 = std::__cxx11::string::length();
    if (0x3fffffff < uVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_140,"keylength >= 2^30",
                 (allocator *)(msg.field_2._M_local_buf + 0xf));
      throwRuntimeError(&local_140);
    }
    if (((this->features_).rejectDupKeys_ & 1U) != 0) {
      pVVar2 = currentValue(this);
      bVar1 = Value::isMember(pVVar2,(string *)&init.limit_);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       "Duplicate key: \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &init.limit_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       "\'");
        std::__cxx11::string::~string((string *)&value);
        this_local._7_1_ =
             addErrorAndRecover(this,(string *)local_168,(Token *)((long)&name.field_2 + 8),
                                tokenObjectEnd);
        numberName.limit_._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_168);
        goto LAB_0013f773;
      }
    }
    pVVar2 = currentValue(this);
    pVStack_198 = Value::operator[](pVVar2,(string *)&init.limit_);
    local_190 = pVStack_198;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              (&this->nodes_,&stack0xfffffffffffffe68);
    comma.end_._7_1_ = readValue(this);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
    if ((comma.end_._7_1_ & 1) == 0) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      numberName.limit_._4_4_ = 1;
      goto LAB_0013f773;
    }
    bVar1 = readToken(this,(Token *)local_1b8);
    if ((!bVar1) ||
       (((local_1b8._0_4_ != tokenObjectEnd && (local_1b8._0_4_ != tokenArraySeparator)) &&
        (local_1b8._0_4_ != tokenComment)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1d8,"Missing \',\' or \'}\' in object declaration",&local_1d9);
      this_local._7_1_ =
           addErrorAndRecover(this,(string *)local_1d8,(Token *)local_1b8,tokenObjectEnd);
      std::__cxx11::string::~string((string *)local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      numberName.limit_._4_4_ = 1;
      goto LAB_0013f773;
    }
    local_1da = true;
    while( true ) {
      local_272 = false;
      if (local_1b8._0_4_ == tokenComment) {
        local_272 = local_1da;
      }
      if (local_272 == false) break;
      local_1da = readToken(this,(Token *)local_1b8);
    }
  } while (local_1b8._0_4_ != tokenObjectEnd);
  this_local._7_1_ = 1;
  numberName.limit_._4_4_ = 1;
LAB_0013f773:
  Value::~Value((Value *)local_80);
  std::__cxx11::string::~string((string *)&init.limit_);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::readObject(Token& tokenStart) {
  Token tokenName;
  JSONCPP_STRING name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    if (name.length() >= (1U<<30)) throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      JSONCPP_STRING msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(
          msg, tokenName, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}